

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# migrate.cpp
# Opt level: O0

void __thiscall wallet::BerkeleyRODatabase::Open(BerkeleyRODatabase *this)

{
  initializer_list<unsigned_int> __l;
  __normal_iterator<std::byte_*,_std::vector<std::byte,_std::allocator<std::byte>_>_> __last;
  bool bVar1;
  bool bVar2;
  uint32_t uVar3;
  int64_t iVar4;
  runtime_error *prVar5;
  DataRecord *pDVar6;
  vector<std::byte,_std::allocator<std::byte>_> *this_00;
  size_type sVar7;
  reference pIVar8;
  add_pointer_t<const_wallet::DataRecord> ptVar9;
  add_pointer_t<const_wallet::OverflowRecord> ptVar10;
  long in_RDI;
  long in_FS_OFFSET;
  pair<std::_Rb_tree_iterator<std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>_>,_bool>
  pVar11;
  uint32_t next_page;
  OverflowRecord *orec;
  DataRecord *drec;
  variant<wallet::DataRecord,_wallet::OverflowRecord> *rec_1;
  vector<std::variant<wallet::DataRecord,_wallet::OverflowRecord>,_std::allocator<std::variant<wallet::DataRecord,_wallet::OverflowRecord>_>_>
  *__range4_1;
  bool is_key;
  InternalRecord *rec;
  vector<wallet::InternalRecord,_std::allocator<wallet::InternalRecord>_> *__range4;
  uint32_t curr_page;
  uint32_t main_db_page;
  uint32_t i;
  uint32_t expected_last_page;
  int64_t size;
  uint32_t page_size;
  FILE *file;
  vector<std::byte,_std::allocator<std::byte>_> data;
  iterator __end4_1;
  iterator __begin4_1;
  vector<std::byte,_std::allocator<std::byte>_> key;
  iterator __end4;
  iterator __begin4;
  vector<unsigned_int,_std::allocator<unsigned_int>_> pages;
  uint32_t offset;
  uint32_t file_1;
  OverflowPage opage;
  PageHeader opage_header;
  RecordsPage rec_page;
  InternalPage int_page;
  PageHeader header_1;
  RecordsPage page;
  PageHeader header;
  AutoFile db_file;
  MetaPage inner_meta;
  MetaPage outer_meta;
  undefined4 in_stack_fffffffffffff6c8;
  uint32_t in_stack_fffffffffffff6cc;
  MetaPage *in_stack_fffffffffffff6d0;
  undefined7 in_stack_fffffffffffff6d8;
  undefined1 in_stack_fffffffffffff6df;
  _Rb_tree_iterator<std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>_>
  in_stack_fffffffffffff6e0;
  map<std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::less<void>,_std::allocator<std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>_>_>
  *this_01;
  allocator_type *in_stack_fffffffffffff6f0;
  vector<std::byte,_std::allocator<std::byte>_> *in_stack_fffffffffffff6f8;
  vector<std::byte,_zero_after_free_allocator<std::byte>_> *this_02;
  allocator_type *in_stack_fffffffffffff700;
  AutoFile *in_stack_fffffffffffff708;
  iterator in_stack_fffffffffffff710;
  __normal_iterator<std::byte_*,_std::vector<std::byte,_std::allocator<std::byte>_>_>
  in_stack_fffffffffffff718;
  undefined7 in_stack_fffffffffffff728;
  char cVar12;
  __normal_iterator<std::byte_*,_std::vector<std::byte,_std::allocator<std::byte>_>_> __first;
  const_iterator __position;
  undefined8 in_stack_fffffffffffff740;
  int origin;
  AutoFile *in_stack_fffffffffffff748;
  undefined4 in_stack_fffffffffffff760;
  int64_t in_stack_fffffffffffff788;
  uint32_t local_794;
  uint local_730;
  undefined1 local_6b0 [64];
  InternalRecord *local_670;
  InternalRecord *local_668;
  byte local_659;
  byte local_658 [24];
  uint32_t local_640;
  uint32_t local_63c;
  undefined8 local_638;
  undefined8 uStack_630;
  undefined8 local_628;
  _Base_ptr local_618;
  undefined1 local_610;
  uint32_t local_5b4;
  char local_5ab;
  char local_4d7;
  undefined4 local_4cc;
  short local_458;
  char local_453;
  uint local_404;
  char local_400;
  uint local_3f8;
  undefined4 local_3c0;
  uint local_1fc;
  char local_1f8;
  uint local_1f0;
  byte local_10;
  long local_8;
  
  origin = (int)((ulong)in_stack_fffffffffffff740 >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  fsbridge::fopen((char *)(in_RDI + 0x20),"rb");
  local_638 = 0;
  uStack_630 = 0;
  local_628 = 0;
  std::vector<std::byte,_std::allocator<std::byte>_>::vector
            ((vector<std::byte,_std::allocator<std::byte>_> *)
             CONCAT44(in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8));
  AutoFile::AutoFile((AutoFile *)in_stack_fffffffffffff710._M_current,
                     (FILE *)in_stack_fffffffffffff708,
                     (vector<std::byte,_std::allocator<std::byte>_> *)in_stack_fffffffffffff700);
  std::vector<std::byte,_std::allocator<std::byte>_>::~vector
            ((vector<std::byte,_std::allocator<std::byte>_> *)
             CONCAT17(in_stack_fffffffffffff6df,in_stack_fffffffffffff6d8));
  bVar1 = AutoFile::IsNull((AutoFile *)CONCAT44(in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8)
                          );
  if (bVar1) {
    prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar5,"BerkeleyRODatabase: Failed to open database file");
    if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
      __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  else {
    MetaPage::MetaPage((MetaPage *)CONCAT44(in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8),0);
    AutoFile::operator>>
              ((AutoFile *)CONCAT17(in_stack_fffffffffffff6df,in_stack_fffffffffffff6d8),
               in_stack_fffffffffffff6d0);
    AutoFile::seek(in_stack_fffffffffffff748,in_stack_fffffffffffff788,origin);
    iVar4 = AutoFile::tell(in_stack_fffffffffffff708);
    if (local_1f0 == (int)(iVar4 / (long)(ulong)local_1fc) - 1U) {
      if (local_1f8 == '\0') {
        local_730 = 0;
        while( true ) {
          uVar3 = (uint32_t)((ulong)in_stack_fffffffffffff6d0 >> 0x20);
          if (local_1f0 <= local_730) break;
          SeekToPage((AutoFile *)CONCAT17(in_stack_fffffffffffff6df,in_stack_fffffffffffff6d8),uVar3
                     ,(uint32_t)in_stack_fffffffffffff6d0);
          AutoFile::operator>>
                    ((AutoFile *)CONCAT17(in_stack_fffffffffffff6df,in_stack_fffffffffffff6d8),
                     &in_stack_fffffffffffff6d0->lsn_file);
          AutoFile::operator>>
                    ((AutoFile *)CONCAT17(in_stack_fffffffffffff6df,in_stack_fffffffffffff6d8),
                     &in_stack_fffffffffffff6d0->lsn_file);
          if ((local_10 & 1) != 0) {
            local_63c = internal_bswap_32(in_stack_fffffffffffff6cc);
            local_640 = internal_bswap_32(in_stack_fffffffffffff6cc);
          }
          if ((local_63c != 0) || (local_640 != 1)) {
            prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::runtime_error::runtime_error
                      (prVar5,
                       "LSNs are not reset, this database is not completely flushed. Please reopen then close the database with a version that has BDB support"
                      );
            if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
              __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
            }
            goto LAB_0037f60d;
          }
          local_730 = local_730 + 1;
        }
        SeekToPage((AutoFile *)CONCAT17(in_stack_fffffffffffff6df,in_stack_fffffffffffff6d8),uVar3,
                   (uint32_t)in_stack_fffffffffffff6d0);
        PageHeader::PageHeader
                  ((PageHeader *)CONCAT44(in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8),0,
                   false);
        AutoFile::operator>>
                  ((AutoFile *)CONCAT17(in_stack_fffffffffffff6df,in_stack_fffffffffffff6d8),
                   (PageHeader *)in_stack_fffffffffffff6d0);
        if (local_453 == '\x05') {
          if (local_458 == 2) {
            RecordsPage::RecordsPage
                      ((RecordsPage *)CONCAT17(in_stack_fffffffffffff6df,in_stack_fffffffffffff6d8),
                       (PageHeader *)in_stack_fffffffffffff6d0);
            AutoFile::operator>>
                      ((AutoFile *)CONCAT17(in_stack_fffffffffffff6df,in_stack_fffffffffffff6d8),
                       (RecordsPage *)in_stack_fffffffffffff6d0);
            std::
            vector<std::variant<wallet::DataRecord,_wallet::OverflowRecord>,_std::allocator<std::variant<wallet::DataRecord,_wallet::OverflowRecord>_>_>
            ::at((vector<std::variant<wallet::DataRecord,_wallet::OverflowRecord>,_std::allocator<std::variant<wallet::DataRecord,_wallet::OverflowRecord>_>_>
                  *)CONCAT17(in_stack_fffffffffffff6df,in_stack_fffffffffffff6d8),
                 (size_type)in_stack_fffffffffffff6d0);
            bVar1 = std::
                    holds_alternative<wallet::DataRecord,wallet::DataRecord,wallet::OverflowRecord>
                              ((variant<wallet::DataRecord,_wallet::OverflowRecord> *)
                               CONCAT44(in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8));
            if (bVar1) {
              std::
              vector<std::variant<wallet::DataRecord,_wallet::OverflowRecord>,_std::allocator<std::variant<wallet::DataRecord,_wallet::OverflowRecord>_>_>
              ::at((vector<std::variant<wallet::DataRecord,_wallet::OverflowRecord>,_std::allocator<std::variant<wallet::DataRecord,_wallet::OverflowRecord>_>_>
                    *)CONCAT17(in_stack_fffffffffffff6df,in_stack_fffffffffffff6d8),
                   (size_type)in_stack_fffffffffffff6d0);
              std::get<wallet::DataRecord,wallet::DataRecord,wallet::OverflowRecord>
                        ((variant<wallet::DataRecord,_wallet::OverflowRecord> *)
                         CONCAT44(in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8));
              bVar1 = std::operator==(in_stack_fffffffffffff6f8,
                                      (vector<std::byte,_std::allocator<std::byte>_> *)
                                      in_stack_fffffffffffff6f0);
              if (((bVar1 ^ 0xffU) & 1) == 0) {
                std::
                vector<std::variant<wallet::DataRecord,_wallet::OverflowRecord>,_std::allocator<std::variant<wallet::DataRecord,_wallet::OverflowRecord>_>_>
                ::at((vector<std::variant<wallet::DataRecord,_wallet::OverflowRecord>,_std::allocator<std::variant<wallet::DataRecord,_wallet::OverflowRecord>_>_>
                      *)CONCAT17(in_stack_fffffffffffff6df,in_stack_fffffffffffff6d8),
                     (size_type)in_stack_fffffffffffff6d0);
                bVar1 = std::
                        holds_alternative<wallet::DataRecord,wallet::DataRecord,wallet::OverflowRecord>
                                  ((variant<wallet::DataRecord,_wallet::OverflowRecord> *)
                                   CONCAT44(in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8));
                if (bVar1) {
                  std::
                  vector<std::variant<wallet::DataRecord,_wallet::OverflowRecord>,_std::allocator<std::variant<wallet::DataRecord,_wallet::OverflowRecord>_>_>
                  ::at((vector<std::variant<wallet::DataRecord,_wallet::OverflowRecord>,_std::allocator<std::variant<wallet::DataRecord,_wallet::OverflowRecord>_>_>
                        *)CONCAT17(in_stack_fffffffffffff6df,in_stack_fffffffffffff6d8),
                       (size_type)in_stack_fffffffffffff6d0);
                  pDVar6 = std::get<wallet::DataRecord,wallet::DataRecord,wallet::OverflowRecord>
                                     ((variant<wallet::DataRecord,_wallet::OverflowRecord> *)
                                      CONCAT44(in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8))
                  ;
                  if ((pDVar6->m_header).len == 4) {
                    std::
                    vector<std::variant<wallet::DataRecord,_wallet::OverflowRecord>,_std::allocator<std::variant<wallet::DataRecord,_wallet::OverflowRecord>_>_>
                    ::at((vector<std::variant<wallet::DataRecord,_wallet::OverflowRecord>,_std::allocator<std::variant<wallet::DataRecord,_wallet::OverflowRecord>_>_>
                          *)CONCAT17(in_stack_fffffffffffff6df,in_stack_fffffffffffff6d8),
                         (size_type)in_stack_fffffffffffff6d0);
                    std::get<wallet::DataRecord,wallet::DataRecord,wallet::OverflowRecord>
                              ((variant<wallet::DataRecord,_wallet::OverflowRecord> *)
                               CONCAT44(in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8));
                    std::vector<std::byte,_std::allocator<std::byte>_>::data
                              ((vector<std::byte,_std::allocator<std::byte>_> *)
                               CONCAT44(in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8));
                    this_00 = (vector<std::byte,_std::allocator<std::byte>_> *)
                              UCharCast((byte *)CONCAT44(in_stack_fffffffffffff6cc,
                                                         in_stack_fffffffffffff6c8));
                    uVar3 = ReadBE32((uchar *)in_stack_fffffffffffff6d0);
                    if (local_1f0 < uVar3) {
                      prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
                      std::runtime_error::runtime_error
                                (prVar5,"Page number is greater than database last page");
                      if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
                        __cxa_throw(prVar5,&std::runtime_error::typeinfo,
                                    std::runtime_error::~runtime_error);
                      }
                    }
                    else {
                      SeekToPage((AutoFile *)
                                 CONCAT17(in_stack_fffffffffffff6df,in_stack_fffffffffffff6d8),
                                 (uint32_t)((ulong)in_stack_fffffffffffff6d0 >> 0x20),
                                 (uint32_t)in_stack_fffffffffffff6d0);
                      MetaPage::MetaPage((MetaPage *)
                                         CONCAT44(in_stack_fffffffffffff6cc,
                                                  in_stack_fffffffffffff6c8),0);
                      AutoFile::operator>>
                                ((AutoFile *)
                                 CONCAT17(in_stack_fffffffffffff6df,in_stack_fffffffffffff6d8),
                                 in_stack_fffffffffffff6d0);
                      if (local_404 == local_1fc) {
                        if (local_1f0 < local_3f8) {
                          prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
                          std::runtime_error::runtime_error
                                    (prVar5,
                                     "Subdatabase last page is greater than database last page");
                          if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
                            __cxa_throw(prVar5,&std::runtime_error::typeinfo,
                                        std::runtime_error::~runtime_error);
                          }
                        }
                        else if (local_400 == '\0') {
                          local_4cc = local_3c0;
                          __position._M_current = &local_659;
                          std::allocator<unsigned_int>::allocator
                                    ((allocator<unsigned_int> *)
                                     CONCAT44(in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8));
                          __l._M_len = (size_type)in_stack_fffffffffffff718._M_current;
                          __l._M_array = (iterator)in_stack_fffffffffffff710._M_current;
                          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                                     in_stack_fffffffffffff708,__l,in_stack_fffffffffffff700);
                          std::allocator<unsigned_int>::~allocator
                                    ((allocator<unsigned_int> *)
                                     CONCAT44(in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8));
                          while (sVar7 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
                                         size((vector<unsigned_int,_std::allocator<unsigned_int>_> *
                                              )CONCAT44(in_stack_fffffffffffff6cc,
                                                        in_stack_fffffffffffff6c8)), sVar7 != 0) {
                            __first._M_current = local_658;
                            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::back
                                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                                       CONCAT44(in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8)
                                      );
                            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::pop_back
                                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                                       CONCAT44(in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8)
                                      );
                            SeekToPage((AutoFile *)
                                       CONCAT17(in_stack_fffffffffffff6df,in_stack_fffffffffffff6d8)
                                       ,(uint32_t)((ulong)in_stack_fffffffffffff6d0 >> 0x20),
                                       (uint32_t)in_stack_fffffffffffff6d0);
                            PageHeader::PageHeader
                                      ((PageHeader *)
                                       CONCAT44(in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8)
                                       ,0,false);
                            AutoFile::operator>>
                                      ((AutoFile *)
                                       CONCAT17(in_stack_fffffffffffff6df,in_stack_fffffffffffff6d8)
                                       ,(PageHeader *)in_stack_fffffffffffff6d0);
                            if (local_4d7 == '\x03') {
                              InternalPage::InternalPage
                                        ((InternalPage *)
                                         CONCAT17(in_stack_fffffffffffff6df,
                                                  in_stack_fffffffffffff6d8),
                                         (PageHeader *)in_stack_fffffffffffff6d0);
                              AutoFile::operator>>
                                        ((AutoFile *)
                                         CONCAT17(in_stack_fffffffffffff6df,
                                                  in_stack_fffffffffffff6d8),
                                         (InternalPage *)in_stack_fffffffffffff6d0);
                              local_668 = (InternalRecord *)
                                          std::
                                          vector<wallet::InternalRecord,_std::allocator<wallet::InternalRecord>_>
                                          ::begin((
                                                  vector<wallet::InternalRecord,_std::allocator<wallet::InternalRecord>_>
                                                  *)in_stack_fffffffffffff6d0);
                              local_670 = (InternalRecord *)
                                          std::
                                          vector<wallet::InternalRecord,_std::allocator<wallet::InternalRecord>_>
                                          ::end((vector<wallet::InternalRecord,_std::allocator<wallet::InternalRecord>_>
                                                 *)in_stack_fffffffffffff6d0);
                              while (bVar1 = __gnu_cxx::
                                             operator==<wallet::InternalRecord_*,_std::vector<wallet::InternalRecord,_std::allocator<wallet::InternalRecord>_>_>
                                                       ((
                                                  __normal_iterator<wallet::InternalRecord_*,_std::vector<wallet::InternalRecord,_std::allocator<wallet::InternalRecord>_>_>
                                                  *)CONCAT17(in_stack_fffffffffffff6df,
                                                             in_stack_fffffffffffff6d8),
                                                  (
                                                  __normal_iterator<wallet::InternalRecord_*,_std::vector<wallet::InternalRecord,_std::allocator<wallet::InternalRecord>_>_>
                                                  *)in_stack_fffffffffffff6d0),
                                    ((bVar1 ^ 0xffU) & 1) != 0) {
                                pIVar8 = __gnu_cxx::
                                         __normal_iterator<wallet::InternalRecord_*,_std::vector<wallet::InternalRecord,_std::allocator<wallet::InternalRecord>_>_>
                                         ::operator*((
                                                  __normal_iterator<wallet::InternalRecord_*,_std::vector<wallet::InternalRecord,_std::allocator<wallet::InternalRecord>_>_>
                                                  *)CONCAT44(in_stack_fffffffffffff6cc,
                                                             in_stack_fffffffffffff6c8));
                                if (((pIVar8->m_header).deleted & 1U) == 0) {
                                  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
                                  push_back((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                                            CONCAT17(in_stack_fffffffffffff6df,
                                                     in_stack_fffffffffffff6d8),
                                            &in_stack_fffffffffffff6d0->lsn_file);
                                }
                                __gnu_cxx::
                                __normal_iterator<wallet::InternalRecord_*,_std::vector<wallet::InternalRecord,_std::allocator<wallet::InternalRecord>_>_>
                                ::operator++((__normal_iterator<wallet::InternalRecord_*,_std::vector<wallet::InternalRecord,_std::allocator<wallet::InternalRecord>_>_>
                                              *)CONCAT44(in_stack_fffffffffffff6cc,
                                                         in_stack_fffffffffffff6c8));
                              }
                              InternalPage::~InternalPage
                                        ((InternalPage *)
                                         CONCAT44(in_stack_fffffffffffff6cc,
                                                  in_stack_fffffffffffff6c8));
                            }
                            else {
                              if (local_4d7 != '\x05') {
                                prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
                                std::runtime_error::runtime_error(prVar5,"Unexpected page type");
                                if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
                                  __cxa_throw(prVar5,&std::runtime_error::typeinfo,
                                              std::runtime_error::~runtime_error);
                                }
                                goto LAB_0037f60d;
                              }
                              cVar12 = local_4d7;
                              RecordsPage::RecordsPage
                                        ((RecordsPage *)
                                         CONCAT17(in_stack_fffffffffffff6df,
                                                  in_stack_fffffffffffff6d8),
                                         (PageHeader *)in_stack_fffffffffffff6d0);
                              AutoFile::operator>>
                                        ((AutoFile *)
                                         CONCAT17(in_stack_fffffffffffff6df,
                                                  in_stack_fffffffffffff6d8),
                                         (RecordsPage *)in_stack_fffffffffffff6d0);
                              sVar7 = std::
                                      vector<std::variant<wallet::DataRecord,_wallet::OverflowRecord>,_std::allocator<std::variant<wallet::DataRecord,_wallet::OverflowRecord>_>_>
                                      ::size((vector<std::variant<wallet::DataRecord,_wallet::OverflowRecord>,_std::allocator<std::variant<wallet::DataRecord,_wallet::OverflowRecord>_>_>
                                              *)CONCAT44(in_stack_fffffffffffff6cc,
                                                         in_stack_fffffffffffff6c8));
                              if ((sVar7 & 1) != 0) {
                                prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
                                std::runtime_error::runtime_error
                                          (prVar5,"Records page has odd number of records");
                                if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
                                  __cxa_throw(prVar5,&std::runtime_error::typeinfo,
                                              std::runtime_error::~runtime_error);
                                }
                                goto LAB_0037f60d;
                              }
                              bVar1 = true;
                              std::vector<std::byte,_std::allocator<std::byte>_>::vector
                                        ((vector<std::byte,_std::allocator<std::byte>_> *)
                                         CONCAT44(in_stack_fffffffffffff6cc,
                                                  in_stack_fffffffffffff6c8));
                              local_6b0._32_8_ =
                                   std::
                                   vector<std::variant<wallet::DataRecord,_wallet::OverflowRecord>,_std::allocator<std::variant<wallet::DataRecord,_wallet::OverflowRecord>_>_>
                                   ::begin((vector<std::variant<wallet::DataRecord,_wallet::OverflowRecord>,_std::allocator<std::variant<wallet::DataRecord,_wallet::OverflowRecord>_>_>
                                            *)in_stack_fffffffffffff6d0);
                              local_6b0._24_8_ =
                                   std::
                                   vector<std::variant<wallet::DataRecord,_wallet::OverflowRecord>,_std::allocator<std::variant<wallet::DataRecord,_wallet::OverflowRecord>_>_>
                                   ::end((vector<std::variant<wallet::DataRecord,_wallet::OverflowRecord>,_std::allocator<std::variant<wallet::DataRecord,_wallet::OverflowRecord>_>_>
                                          *)in_stack_fffffffffffff6d0);
                              while (bVar2 = __gnu_cxx::
                                             operator==<std::variant<wallet::DataRecord,_wallet::OverflowRecord>_*,_std::vector<std::variant<wallet::DataRecord,_wallet::OverflowRecord>,_std::allocator<std::variant<wallet::DataRecord,_wallet::OverflowRecord>_>_>_>
                                                       ((
                                                  __normal_iterator<std::variant<wallet::DataRecord,_wallet::OverflowRecord>_*,_std::vector<std::variant<wallet::DataRecord,_wallet::OverflowRecord>,_std::allocator<std::variant<wallet::DataRecord,_wallet::OverflowRecord>_>_>_>
                                                  *)CONCAT17(in_stack_fffffffffffff6df,
                                                             in_stack_fffffffffffff6d8),
                                                  (
                                                  __normal_iterator<std::variant<wallet::DataRecord,_wallet::OverflowRecord>_*,_std::vector<std::variant<wallet::DataRecord,_wallet::OverflowRecord>,_std::allocator<std::variant<wallet::DataRecord,_wallet::OverflowRecord>_>_>_>
                                                  *)in_stack_fffffffffffff6d0),
                                    ((bVar2 ^ 0xffU) & 1) != 0) {
                                __gnu_cxx::
                                __normal_iterator<std::variant<wallet::DataRecord,_wallet::OverflowRecord>_*,_std::vector<std::variant<wallet::DataRecord,_wallet::OverflowRecord>,_std::allocator<std::variant<wallet::DataRecord,_wallet::OverflowRecord>_>_>_>
                                ::operator*((__normal_iterator<std::variant<wallet::DataRecord,_wallet::OverflowRecord>_*,_std::vector<std::variant<wallet::DataRecord,_wallet::OverflowRecord>,_std::allocator<std::variant<wallet::DataRecord,_wallet::OverflowRecord>_>_>_>
                                             *)CONCAT44(in_stack_fffffffffffff6cc,
                                                        in_stack_fffffffffffff6c8));
                                std::vector<std::byte,_std::allocator<std::byte>_>::vector
                                          ((vector<std::byte,_std::allocator<std::byte>_> *)
                                           CONCAT44(in_stack_fffffffffffff6cc,
                                                    in_stack_fffffffffffff6c8));
                                ptVar9 = std::
                                         get_if<wallet::DataRecord,wallet::DataRecord,wallet::OverflowRecord>
                                                   ((
                                                  variant<wallet::DataRecord,_wallet::OverflowRecord>
                                                  *)CONCAT44(in_stack_fffffffffffff6cc,
                                                             in_stack_fffffffffffff6c8));
                                if (ptVar9 == (add_pointer_t<const_wallet::DataRecord>)0x0) {
                                  ptVar10 = std::
                                            get_if<wallet::OverflowRecord,wallet::DataRecord,wallet::OverflowRecord>
                                                      ((
                                                  variant<wallet::DataRecord,_wallet::OverflowRecord>
                                                  *)CONCAT44(in_stack_fffffffffffff6cc,
                                                             in_stack_fffffffffffff6c8));
                                  if (ptVar10 != (add_pointer_t<const_wallet::OverflowRecord>)0x0) {
                                    if (((ptVar10->m_header).deleted & 1U) != 0) goto LAB_0037f46b;
                                    local_794 = ptVar10->page_number;
                                    while (local_794 != 0) {
                                      SeekToPage((AutoFile *)
                                                 CONCAT17(in_stack_fffffffffffff6df,
                                                          in_stack_fffffffffffff6d8),
                                                 (uint32_t)
                                                 ((ulong)in_stack_fffffffffffff6d0 >> 0x20),
                                                 (uint32_t)in_stack_fffffffffffff6d0);
                                      PageHeader::PageHeader
                                                ((PageHeader *)
                                                 CONCAT44(in_stack_fffffffffffff6cc,
                                                          in_stack_fffffffffffff6c8),0,false);
                                      AutoFile::operator>>
                                                ((AutoFile *)
                                                 CONCAT17(in_stack_fffffffffffff6df,
                                                          in_stack_fffffffffffff6d8),
                                                 (PageHeader *)in_stack_fffffffffffff6d0);
                                      if (local_5ab != '\a') {
                                        prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
                                        std::runtime_error::runtime_error
                                                  (prVar5,"Bad overflow record page type");
                                        if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
                                          __cxa_throw(prVar5,&std::runtime_error::typeinfo,
                                                      std::runtime_error::~runtime_error);
                                        }
                                        goto LAB_0037f60d;
                                      }
                                      OverflowPage::OverflowPage
                                                ((OverflowPage *)
                                                 CONCAT44(in_stack_fffffffffffff6cc,
                                                          in_stack_fffffffffffff6c8),
                                                 (PageHeader *)0x37f1c5);
                                      AutoFile::operator>>
                                                ((AutoFile *)
                                                 CONCAT17(in_stack_fffffffffffff6df,
                                                          in_stack_fffffffffffff6d8),
                                                 (OverflowPage *)in_stack_fffffffffffff6d0);
                                      std::vector<std::byte,_std::allocator<std::byte>_>::end
                                                ((vector<std::byte,_std::allocator<std::byte>_> *)
                                                 in_stack_fffffffffffff6d0);
                                      __gnu_cxx::
                                      __normal_iterator<std::byte_const*,std::vector<std::byte,std::allocator<std::byte>>>
                                      ::__normal_iterator<std::byte*>
                                                ((__normal_iterator<const_std::byte_*,_std::vector<std::byte,_std::allocator<std::byte>_>_>
                                                  *)CONCAT17(in_stack_fffffffffffff6df,
                                                             in_stack_fffffffffffff6d8),
                                                 (__normal_iterator<std::byte_*,_std::vector<std::byte,_std::allocator<std::byte>_>_>
                                                  *)in_stack_fffffffffffff6d0);
                                      std::vector<std::byte,_std::allocator<std::byte>_>::begin
                                                ((vector<std::byte,_std::allocator<std::byte>_> *)
                                                 in_stack_fffffffffffff6d0);
                                      std::vector<std::byte,_std::allocator<std::byte>_>::end
                                                ((vector<std::byte,_std::allocator<std::byte>_> *)
                                                 in_stack_fffffffffffff6d0);
                                      __last._M_current._7_1_ = cVar12;
                                      __last._M_current._0_7_ = in_stack_fffffffffffff728;
                                      in_stack_fffffffffffff710 =
                                           std::vector<std::byte,std::allocator<std::byte>>::
                                           insert<__gnu_cxx::__normal_iterator<std::byte*,std::vector<std::byte,std::allocator<std::byte>>>,void>
                                                     ((vector<std::byte,_std::allocator<std::byte>_>
                                                       *)in_stack_fffffffffffff6f0,__position,
                                                      __first,__last);
                                      local_794 = local_5b4;
                                      OverflowPage::~OverflowPage
                                                ((OverflowPage *)
                                                 CONCAT44(in_stack_fffffffffffff6cc,
                                                          in_stack_fffffffffffff6c8));
                                    }
                                  }
LAB_0037f2bd:
                                  if (bVar1) {
                                    std::vector<std::byte,_std::allocator<std::byte>_>::operator=
                                              (this_00,(
                                                  vector<std::byte,_std::allocator<std::byte>_> *)
                                                  CONCAT44(uVar3,in_stack_fffffffffffff760));
                                  }
                                  else {
                                    in_stack_fffffffffffff6f0 = (allocator_type *)(in_RDI + 0x48);
                                    this_02 = (vector<std::byte,_zero_after_free_allocator<std::byte>_>
                                               *)(local_6b0 + 0x28);
                                    std::vector<std::byte,_std::allocator<std::byte>_>::begin
                                              ((vector<std::byte,_std::allocator<std::byte>_> *)
                                               in_stack_fffffffffffff6d0);
                                    std::vector<std::byte,_std::allocator<std::byte>_>::end
                                              ((vector<std::byte,_std::allocator<std::byte>_> *)
                                               in_stack_fffffffffffff6d0);
                                    std::vector<std::byte,zero_after_free_allocator<std::byte>>::
                                    vector<__gnu_cxx::__normal_iterator<std::byte*,std::vector<std::byte,std::allocator<std::byte>>>,void>
                                              (this_02,in_stack_fffffffffffff718,
                                               (__normal_iterator<std::byte_*,_std::vector<std::byte,_std::allocator<std::byte>_>_>
                                                )in_stack_fffffffffffff710._M_current,
                                               in_stack_fffffffffffff6f0);
                                    this_01 = (map<std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::less<void>,_std::allocator<std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>_>_>
                                               *)local_6b0;
                                    std::vector<std::byte,_std::allocator<std::byte>_>::begin
                                              ((vector<std::byte,_std::allocator<std::byte>_> *)
                                               in_stack_fffffffffffff6d0);
                                    std::vector<std::byte,_std::allocator<std::byte>_>::end
                                              ((vector<std::byte,_std::allocator<std::byte>_> *)
                                               in_stack_fffffffffffff6d0);
                                    std::vector<std::byte,zero_after_free_allocator<std::byte>>::
                                    vector<__gnu_cxx::__normal_iterator<std::byte*,std::vector<std::byte,std::allocator<std::byte>>>,void>
                                              (this_02,in_stack_fffffffffffff718,
                                               (__normal_iterator<std::byte_*,_std::vector<std::byte,_std::allocator<std::byte>_>_>
                                                )in_stack_fffffffffffff710._M_current,
                                               in_stack_fffffffffffff6f0);
                                    pVar11 = std::
                                             map<std::vector<std::byte,zero_after_free_allocator<std::byte>>,std::vector<std::byte,zero_after_free_allocator<std::byte>>,std::less<void>,std::allocator<std::pair<std::vector<std::byte,zero_after_free_allocator<std::byte>>const,std::vector<std::byte,zero_after_free_allocator<std::byte>>>>>
                                             ::
                                             emplace<std::vector<std::byte,zero_after_free_allocator<std::byte>>,std::vector<std::byte,zero_after_free_allocator<std::byte>>>
                                                       (this_01,(
                                                  vector<std::byte,_zero_after_free_allocator<std::byte>_>
                                                  *)in_stack_fffffffffffff6e0._M_node,
                                                  (
                                                  vector<std::byte,_zero_after_free_allocator<std::byte>_>
                                                  *)CONCAT17(in_stack_fffffffffffff6df,
                                                             in_stack_fffffffffffff6d8));
                                    in_stack_fffffffffffff6e0 = pVar11.first._M_node;
                                    in_stack_fffffffffffff6df = pVar11.second;
                                    local_618 = in_stack_fffffffffffff6e0._M_node;
                                    local_610 = in_stack_fffffffffffff6df;
                                    std::vector<std::byte,_zero_after_free_allocator<std::byte>_>::
                                    ~vector((vector<std::byte,_zero_after_free_allocator<std::byte>_>
                                             *)CONCAT17(in_stack_fffffffffffff6df,
                                                        in_stack_fffffffffffff6d8));
                                    std::vector<std::byte,_zero_after_free_allocator<std::byte>_>::
                                    ~vector((vector<std::byte,_zero_after_free_allocator<std::byte>_>
                                             *)CONCAT17(in_stack_fffffffffffff6df,
                                                        in_stack_fffffffffffff6d8));
                                    std::vector<std::byte,_std::allocator<std::byte>_>::clear
                                              ((vector<std::byte,_std::allocator<std::byte>_> *)
                                               CONCAT44(in_stack_fffffffffffff6cc,
                                                        in_stack_fffffffffffff6c8));
                                  }
                                  bVar1 = (bool)(bVar1 ^ 1);
                                }
                                else if (((ptVar9->m_header).deleted & 1U) == 0) {
                                  std::vector<std::byte,_std::allocator<std::byte>_>::operator=
                                            (this_00,(vector<std::byte,_std::allocator<std::byte>_>
                                                      *)CONCAT44(uVar3,in_stack_fffffffffffff760));
                                  goto LAB_0037f2bd;
                                }
LAB_0037f46b:
                                std::vector<std::byte,_std::allocator<std::byte>_>::~vector
                                          ((vector<std::byte,_std::allocator<std::byte>_> *)
                                           CONCAT17(in_stack_fffffffffffff6df,
                                                    in_stack_fffffffffffff6d8));
                                __gnu_cxx::
                                __normal_iterator<std::variant<wallet::DataRecord,_wallet::OverflowRecord>_*,_std::vector<std::variant<wallet::DataRecord,_wallet::OverflowRecord>,_std::allocator<std::variant<wallet::DataRecord,_wallet::OverflowRecord>_>_>_>
                                ::operator++((__normal_iterator<std::variant<wallet::DataRecord,_wallet::OverflowRecord>_*,_std::vector<std::variant<wallet::DataRecord,_wallet::OverflowRecord>,_std::allocator<std::variant<wallet::DataRecord,_wallet::OverflowRecord>_>_>_>
                                              *)CONCAT44(in_stack_fffffffffffff6cc,
                                                         in_stack_fffffffffffff6c8));
                              }
                              std::vector<std::byte,_std::allocator<std::byte>_>::~vector
                                        ((vector<std::byte,_std::allocator<std::byte>_> *)
                                         CONCAT17(in_stack_fffffffffffff6df,
                                                  in_stack_fffffffffffff6d8));
                              RecordsPage::~RecordsPage
                                        ((RecordsPage *)
                                         CONCAT44(in_stack_fffffffffffff6cc,
                                                  in_stack_fffffffffffff6c8));
                            }
                          }
                          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                                     CONCAT17(in_stack_fffffffffffff6df,in_stack_fffffffffffff6d8));
                          RecordsPage::~RecordsPage
                                    ((RecordsPage *)
                                     CONCAT44(in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8));
                          AutoFile::~AutoFile((AutoFile *)
                                              CONCAT44(in_stack_fffffffffffff6cc,
                                                       in_stack_fffffffffffff6c8));
                          if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
                            return;
                          }
                        }
                        else {
                          prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
                          std::runtime_error::runtime_error
                                    (prVar5,"BDB builtin encryption is not supported");
                          if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
                            __cxa_throw(prVar5,&std::runtime_error::typeinfo,
                                        std::runtime_error::~runtime_error);
                          }
                        }
                      }
                      else {
                        prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
                        std::runtime_error::runtime_error(prVar5,"Unexpected page size");
                        if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
                          __cxa_throw(prVar5,&std::runtime_error::typeinfo,
                                      std::runtime_error::~runtime_error);
                        }
                      }
                    }
                    goto LAB_0037f60d;
                  }
                }
                prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
                std::runtime_error::runtime_error
                          (prVar5,"Subdatabase page number has unexpected length");
                if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
                  __cxa_throw(prVar5,&std::runtime_error::typeinfo,
                              std::runtime_error::~runtime_error);
                }
                goto LAB_0037f60d;
              }
            }
            prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::runtime_error::runtime_error(prVar5,"Subdatabase has an unexpected name");
            if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
              __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
            }
          }
          else {
            prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::runtime_error::runtime_error
                      (prVar5,"Unexpected number of entries in outer database root page");
            if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
              __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
            }
          }
        }
        else {
          prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(prVar5,"Unexpected outer database root page type");
          if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
            __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
          }
        }
      }
      else {
        prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar5,"BDB builtin encryption is not supported");
        if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
          __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
      }
    }
    else {
      prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar5,"Last page number could not fit in file");
      if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
        __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
    }
  }
LAB_0037f60d:
  __stack_chk_fail();
}

Assistant:

void BerkeleyRODatabase::Open()
{
    // Open the file
    FILE* file = fsbridge::fopen(m_filepath, "rb");
    AutoFile db_file(file);
    if (db_file.IsNull()) {
        throw std::runtime_error("BerkeleyRODatabase: Failed to open database file");
    }

    uint32_t page_size = 4096; // Default page size

    // Read the outer metapage
    // Expected page number is 0
    MetaPage outer_meta(0);
    db_file >> outer_meta;
    page_size = outer_meta.pagesize;

    // Verify the size of the file is a multiple of the page size
    db_file.seek(0, SEEK_END);
    int64_t size = db_file.tell();

    // Since BDB stores everything in a page, the file size should be a multiple of the page size;
    // However, BDB doesn't actually check that this is the case, and enforcing this check results
    // in us rejecting a database that BDB would not, so this check needs to be excluded.
    // This is left commented out as a reminder to not accidentally implement this in the future.
    // if (size % page_size != 0) {
    //     throw std::runtime_error("File size is not a multiple of page size");
    // }

    // Check the last page number
    uint32_t expected_last_page{uint32_t((size / page_size) - 1)};
    if (outer_meta.last_page != expected_last_page) {
        throw std::runtime_error("Last page number could not fit in file");
    }

    // Make sure encryption is disabled
    if (outer_meta.encrypt_algo != 0) {
        throw std::runtime_error("BDB builtin encryption is not supported");
    }

    // Check all Log Sequence Numbers (LSN) point to file 0 and offset 1 which indicates that the LSNs were
    // reset and that the log files are not necessary to get all of the data in the database.
    for (uint32_t i = 0; i < outer_meta.last_page; ++i) {
        // The LSN is composed of 2 32-bit ints, the first is a file id, the second an offset
        // It will always be the first 8 bytes of a page, so we deserialize it directly for every page
        uint32_t file;
        uint32_t offset;
        SeekToPage(db_file, i, page_size);
        db_file >> file >> offset;
        if (outer_meta.other_endian) {
            file = internal_bswap_32(file);
            offset = internal_bswap_32(offset);
        }
        if (file != 0 || offset != 1) {
            throw std::runtime_error("LSNs are not reset, this database is not completely flushed. Please reopen then close the database with a version that has BDB support");
        }
    }

    // Read the root page
    SeekToPage(db_file, outer_meta.root, page_size);
    PageHeader header(outer_meta.root, outer_meta.other_endian);
    db_file >> header;
    if (header.type != PageType::BTREE_LEAF) {
        throw std::runtime_error("Unexpected outer database root page type");
    }
    if (header.entries != 2) {
        throw std::runtime_error("Unexpected number of entries in outer database root page");
    }
    RecordsPage page(header);
    db_file >> page;

    // First record should be the string "main"
    if (!std::holds_alternative<DataRecord>(page.records.at(0)) || std::get<DataRecord>(page.records.at(0)).data != SUBDATABASE_NAME) {
        throw std::runtime_error("Subdatabase has an unexpected name");
    }
    // Check length of page number for subdatabase location
    if (!std::holds_alternative<DataRecord>(page.records.at(1)) || std::get<DataRecord>(page.records.at(1)).m_header.len != 4) {
        throw std::runtime_error("Subdatabase page number has unexpected length");
    }

    // Read subdatabase page number
    // It is written as a big endian 32 bit number
    uint32_t main_db_page = ReadBE32(UCharCast(std::get<DataRecord>(page.records.at(1)).data.data()));

    // The main database is in a page that doesn't exist
    if (main_db_page > outer_meta.last_page) {
        throw std::runtime_error("Page number is greater than database last page");
    }

    // Read the inner metapage
    SeekToPage(db_file, main_db_page, page_size);
    MetaPage inner_meta(main_db_page);
    db_file >> inner_meta;

    if (inner_meta.pagesize != page_size) {
        throw std::runtime_error("Unexpected page size");
    }

    if (inner_meta.last_page > outer_meta.last_page) {
        throw std::runtime_error("Subdatabase last page is greater than database last page");
    }

    // Make sure encryption is disabled
    if (inner_meta.encrypt_algo != 0) {
        throw std::runtime_error("BDB builtin encryption is not supported");
    }

    // Do a DFS through the BTree, starting at root
    std::vector<uint32_t> pages{inner_meta.root};
    while (pages.size() > 0) {
        uint32_t curr_page = pages.back();
        // It turns out BDB completely ignores this last_page field and doesn't actually update it to the correct
        // last page. While we should be checking this, we can't.
        // This is left commented out as a reminder to not accidentally implement this in the future.
        // if (curr_page > inner_meta.last_page) {
        //     throw std::runtime_error("Page number is greater than subdatabase last page");
        // }
        pages.pop_back();
        SeekToPage(db_file, curr_page, page_size);
        PageHeader header(curr_page, inner_meta.other_endian);
        db_file >> header;
        switch (header.type) {
        case PageType::BTREE_INTERNAL: {
            InternalPage int_page(header);
            db_file >> int_page;
            for (const InternalRecord& rec : int_page.records) {
                if (rec.m_header.deleted) continue;
                pages.push_back(rec.page_num);
            }
            break;
        }
        case PageType::BTREE_LEAF: {
            RecordsPage rec_page(header);
            db_file >> rec_page;
            if (rec_page.records.size() % 2 != 0) {
                // BDB stores key value pairs in consecutive records, thus an odd number of records is unexpected
                throw std::runtime_error("Records page has odd number of records");
            }
            bool is_key = true;
            std::vector<std::byte> key;
            for (const std::variant<DataRecord, OverflowRecord>& rec : rec_page.records) {
                std::vector<std::byte> data;
                if (const DataRecord* drec = std::get_if<DataRecord>(&rec)) {
                    if (drec->m_header.deleted) continue;
                    data = drec->data;
                } else if (const OverflowRecord* orec = std::get_if<OverflowRecord>(&rec)) {
                    if (orec->m_header.deleted) continue;
                    uint32_t next_page = orec->page_number;
                    while (next_page != 0) {
                        SeekToPage(db_file, next_page, page_size);
                        PageHeader opage_header(next_page, inner_meta.other_endian);
                        db_file >> opage_header;
                        if (opage_header.type != PageType::OVERFLOW_DATA) {
                            throw std::runtime_error("Bad overflow record page type");
                        }
                        OverflowPage opage(opage_header);
                        db_file >> opage;
                        data.insert(data.end(), opage.data.begin(), opage.data.end());
                        next_page = opage_header.next_page;
                    }
                }

                if (is_key) {
                    key = data;
                } else {
                    m_records.emplace(SerializeData{key.begin(), key.end()}, SerializeData{data.begin(), data.end()});
                    key.clear();
                }
                is_key = !is_key;
            }
            break;
        }
        default:
            throw std::runtime_error("Unexpected page type");
        }
    }
}